

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_roundtrip.cpp
# Opt level: O0

void TestParquetRoundtrip(string *path)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> query;
  Connection con;
  DuckDB db;
  DBConfig config;
  undefined4 in_stack_fffffffffffff7a8;
  Flags in_stack_fffffffffffff7ac;
  undefined6 in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7b6;
  undefined1 in_stack_fffffffffffff7b7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7b8;
  SourceLineInfo *this;
  undefined6 in_stack_fffffffffffff7c0;
  undefined1 in_stack_fffffffffffff7c6;
  undefined1 in_stack_fffffffffffff7c7;
  SourceLineInfo *this_00;
  DBConfig *this_01;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7df;
  AssertionHandler *in_stack_fffffffffffff7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  char *in_stack_fffffffffffff7f8;
  SourceLineInfo local_790;
  StringRef local_780;
  string local_728 [32];
  string local_708 [32];
  Connection local_6e8 [48];
  DuckDB local_6b8 [16];
  DBConfig local_6a8 [359];
  undefined1 in_stack_fffffffffffffabf;
  string *in_stack_fffffffffffffac0;
  Connection *in_stack_fffffffffffffac8;
  
  this_01 = local_6a8;
  duckdb::DBConfig::DBConfig(this_01);
  duckdb::DuckDB::DuckDB(local_6b8,(char *)0x0,this_01);
  duckdb::Connection::Connection(local_6e8,local_6b8);
  std::operator+(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  std::operator+(in_stack_fffffffffffff7b8,
                 (char *)CONCAT17(in_stack_fffffffffffff7b7,
                                  CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)));
  std::__cxx11::string::~string(local_728);
  local_780 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffff7b7,
                                          CONCAT16(in_stack_fffffffffffff7b6,
                                                   in_stack_fffffffffffff7b0)),
                         CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  this_00 = &local_790;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/arrow/arrow_roundtrip.cpp"
             ,0x29);
  Catch::StringRef::StringRef
            ((StringRef *)
             CONCAT17(in_stack_fffffffffffff7c7,
                      CONCAT16(in_stack_fffffffffffff7c6,in_stack_fffffffffffff7c0)),
             (char *)in_stack_fffffffffffff7b8);
  capturedExpression.m_size = (size_type)this_01;
  capturedExpression.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff7c7,
                      CONCAT16(in_stack_fffffffffffff7c6,in_stack_fffffffffffff7c0)),
             (StringRef *)in_stack_fffffffffffff7b8,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff7b7,
                      CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
             capturedExpression,in_stack_fffffffffffff7ac);
  uVar1 = duckdb::ArrowTestHelper::RunArrowComparison
                    (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                     (bool)in_stack_fffffffffffffabf);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff7e0,
             (ExprLhs<bool> *)CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff7b7,
                      CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)
             CONCAT17(in_stack_fffffffffffff7b7,
                      CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)));
  operator____catch_sr
            ((char *)CONCAT17(in_stack_fffffffffffff7b7,
                              CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  this = (SourceLineInfo *)&stack0xfffffffffffff7f0;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/arrow/arrow_roundtrip.cpp"
             ,0x2a);
  Catch::StringRef::StringRef
            ((StringRef *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffff7c0)),
             (char *)this);
  capturedExpression_00.m_size = (size_type)this_01;
  capturedExpression_00.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffff7c0)),
             (StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffff7b7,
                      CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
             capturedExpression_00,in_stack_fffffffffffff7ac);
  uVar1 = duckdb::ArrowTestHelper::RunArrowComparison
                    (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                     (bool)in_stack_fffffffffffffabf);
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffff7e0,
             (ExprLhs<bool> *)CONCAT17(EVar2.m_lhs,in_stack_fffffffffffff7d8));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffff7b0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffff7b0)));
  std::__cxx11::string::~string(local_708);
  duckdb::Connection::~Connection(local_6e8);
  duckdb::DuckDB::~DuckDB(local_6b8);
  duckdb::DBConfig::~DBConfig(local_6a8);
  return;
}

Assistant:

static void TestParquetRoundtrip(const string &path) {
	DBConfig config;
	// This needs to be set since this test will be triggered when testing autoloading
	config.options.allow_unsigned_extensions = true;

	DuckDB db(nullptr, &config);
	Connection con(db);

	// run the query
	auto query = "SELECT * FROM parquet_scan('" + path + "')";
	REQUIRE(ArrowTestHelper::RunArrowComparison(con, query, true));
	REQUIRE(ArrowTestHelper::RunArrowComparison(con, query));
}